

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O1

XmlNodePtr __thiscall libcellml::XmlDoc::rootNode(XmlDoc *this)

{
  XmlDocImpl *this_00;
  XmlDoc this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  XmlNode *__tmp;
  undefined1 auVar2 [16];
  XmlNodePtr XVar3;
  xmlNodePtr root;
  undefined1 local_29;
  XmlDoc local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  xmlNodePtr local_18;
  
  auVar2 = xmlDocGetRootElement(*(undefined8 *)*in_RSI);
  _Var1._M_pi = auVar2._8_8_;
  local_18 = auVar2._0_8_;
  this->mPimpl = (XmlDocImpl *)0x0;
  this[1].mPimpl = (XmlDocImpl *)0x0;
  if (local_18 != (xmlNodePtr)0x0) {
    local_28.mPimpl = (XmlDocImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
              (&_Stack_20,(XmlNode **)&local_28,(allocator<libcellml::XmlNode> *)&local_29);
    _Var1._M_pi = _Stack_20._M_pi;
    this_01.mPimpl = local_28.mPimpl;
    local_28.mPimpl = (XmlDocImpl *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->mPimpl = (XmlDocImpl *)this_01;
    this_00 = this[1].mPimpl;
    this[1].mPimpl = (XmlDocImpl *)_Var1._M_pi;
    if (this_00 != (XmlDocImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
    XmlNode::setXmlNode((XmlNode *)this_01.mPimpl,&local_18);
    _Var1._M_pi = extraout_RDX;
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlDoc::rootNode() const
{
    xmlNodePtr root = xmlDocGetRootElement(mPimpl->mXmlDocPtr);
    XmlNodePtr rootHandle = nullptr;
    if (root != nullptr) {
        rootHandle = std::make_shared<XmlNode>();
        rootHandle->setXmlNode(root);
    }
    return rootHandle;
}